

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void Am_Connection::Handle_Sockets(fd_set *readfds)

{
  Am_Connection_Data *pAVar1;
  Am_Connection *pAVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  connection_list_class *pcVar6;
  socklen_t i;
  sockaddr_in sa;
  socklen_t local_2c;
  sockaddr local_28;
  
  pcVar6 = connection_list;
  if (num_sockets != 0) {
    for (; pcVar6 != (Connection_List_Ptr)0x0; pcVar6 = pcVar6->next) {
      pAVar1 = pcVar6->connection_ptr->data;
      if (pAVar1->connected == true) {
        uVar4 = *(uint *)&(pAVar1->super_Am_Wrapper).field_0xc;
        uVar5 = uVar4 + 0x3f;
        if (-1 < (int)uVar4) {
          uVar5 = uVar4;
        }
        if (((ulong)readfds->fds_bits[(int)uVar5 >> 6] >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
          Handle_Input(pcVar6->connection_ptr);
        }
      }
    }
    iVar3 = m_parent_socket + 0x3f;
    if (-1 < m_parent_socket) {
      iVar3 = m_parent_socket;
    }
    if ((m_parent_socket != 0) &&
       (pcVar6 = connection_list,
       (1L << ((byte)m_parent_socket & 0x3f) & readfds->fds_bits[iVar3 >> 6]) != 0)) {
      while( true ) {
        if (pcVar6 == (Connection_List_Ptr)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"C:hs: remote connection received without receiving",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"connection waiting\n",0x13);
          std::ostream::flush();
          return;
        }
        if (pcVar6->connection_ptr->data->waiting != false) break;
        pcVar6 = pcVar6->next;
      }
      local_2c = 0x10;
      uVar4 = accept(m_parent_socket,&local_28,&local_2c);
      if ((int)uVar4 < 0) {
        perror("accept");
      }
      else {
        pAVar2 = pcVar6->connection_ptr;
        *(uint *)&(pAVar2->data->super_Am_Wrapper).field_0xc = uVar4;
        socket_flags->fds_bits[uVar4 >> 6] =
             socket_flags->fds_bits[uVar4 >> 6] | 1L << ((byte)uVar4 & 0x3f);
        pAVar1 = pAVar2->data;
        pAVar1->waiting = false;
        if (pAVar1 != (Am_Connection_Data *)0x0) {
          pAVar1->connected = true;
        }
      }
    }
  }
  return;
}

Assistant:

void
Am_Connection::Handle_Sockets(fd_set *readfds)
{
  if (!num_sockets)
    return;
  else {

    Connection_List_Ptr local_list;
    local_list = connection_list;
    ////
    //// Check Connections for incoming data
    ////
    while (local_list != nullptr) {
      if ((local_list->connection_ptr->Connected()) &&
          (FD_ISSET((local_list->connection_ptr->Get_Socket()), readfds))) {
        local_list->connection_ptr->Handle_Input();
      }
      local_list = local_list->next;
    }
    ////
    //// Check Parent socket for new connections
    ////
    /* This assumes that we don't need each side to specify the other.
 * The first waiting connection will get the first caller.
 * A better way might be to have the Handle sockets check the address of
 * the caller.
 */
    if ((FD_ISSET(m_parent_socket, readfds)) && (m_parent_socket != 0)) {
      local_list = connection_list;
      while ((local_list != nullptr) &&
             (!(local_list->connection_ptr->Waiting()))) {
        local_list = local_list->next;
      }
      if (local_list == nullptr)
        std::cerr << "C:hs: remote connection received without receiving"
                  << "connection waiting\n"
                  << std::flush;
      else {
        socklen_t i;
        int temp_socket;
        struct sockaddr_in sa;
        i = sizeof(sa);
        if ((temp_socket =
                 accept(m_parent_socket, (struct sockaddr *)&sa, &i)) < 0) {
          perror("accept");
        } else {
          local_list->connection_ptr->Set_Socket(temp_socket);
          local_list->connection_ptr->Set_Waiting_Flag(false);
          local_list->connection_ptr->Set_Connect_Flag(true);
        }

      } // Found new connection
    }   // someone trying to connect to parent
  }     // There is at least 1 connection
}